

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

int coda_ascii_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_native_type cVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  coda_type_class cVar5;
  coda_product_struct *pcVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t __n;
  anon_struct_24_3_5e6533e2 *paVar11;
  char *message;
  coda_product *product;
  coda_type *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int64_t length;
  ulong *puVar16;
  uint8_t buffer_2 [1];
  int64_t bit_size_boundary;
  char buffer [64];
  coda_cursor spec_cursor;
  uint8_t local_3b9;
  long local_3b8;
  ulong local_3b0;
  anon_struct_24_3_5e6533e2 *local_3a8;
  ulong local_3a0;
  ulong local_398;
  long local_390;
  char local_388 [64];
  coda_cursor local_348;
  
  pcVar12 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar12->format) {
    pcVar12 = *(coda_type **)&pcVar12->type_class;
  }
  if (-1 < pcVar12->bit_size) {
    *bit_size = pcVar12->bit_size;
    return 0;
  }
  if (pcVar12->type_class < 2) {
    iVar3 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar3;
  }
  paVar11 = cursor->stack;
  lVar10 = cursor->stack[(long)cursor->n + -1].bit_offset;
  length = -1;
  iVar3 = get_bit_size_boundary(cursor,(int64_t *)&local_3b0,-1);
  if (iVar3 == 0) {
    iVar3 = pcVar12->type_class;
    if (iVar3 - 2U < 2) {
      puVar16 = (ulong *)pcVar12[1].description;
      if (puVar16 == (ulong *)0x0) {
        length = -1;
        if (pcVar12->size_expr != (coda_expression *)0x0) goto LAB_001428b4;
        puVar16 = (ulong *)0x0;
      }
LAB_00142796:
      local_3a0 = local_3b0;
      length = 0x40;
      if ((long)local_3b0 >> 3 < 0x40) {
        length = (long)local_3b0 >> 3;
      }
      local_3a8 = paVar11;
      iVar3 = read_bytes_in_bounds(cursor->product,lVar10 >> 3,length,local_388);
      if (iVar3 == 0) {
        paVar11 = local_3a8;
        local_3b8 = length;
        if (puVar16 != (ulong *)0x0) {
          lVar10 = (long)(int)puVar16[1];
          if (0 < lVar10) {
            uVar9 = puVar16[2];
            lVar14 = 0;
            uVar8 = local_3a0;
            local_398 = uVar9;
            local_390 = lVar10;
            do {
              piVar2 = *(int **)(uVar9 + lVar14 * 8);
              iVar3 = *piVar2;
              __n = (size_t)iVar3;
              if (__n == 0) {
                if (uVar8 < 8) {
                  local_3b0 = 0;
                  goto LAB_00142ab7;
                }
              }
              else if (((long)__n <= local_3b8) &&
                      (iVar4 = bcmp(*(void **)(piVar2 + 2),local_388,__n), uVar8 = local_3a0,
                      lVar10 = local_390, uVar9 = local_398, iVar4 == 0)) {
                local_3b0 = (ulong)(iVar3 << 3);
                goto LAB_00142ab7;
              }
              lVar14 = lVar14 + 1;
            } while (lVar10 != lVar14);
          }
          local_3b0 = *puVar16;
          paVar11 = local_3a8;
          length = local_3b8;
          if (-1 < (long)local_3b0) goto LAB_00142ab7;
        }
        goto LAB_001428b4;
      }
      goto LAB_0014272b;
    }
    if (iVar3 == 4) {
      length = -1;
      if (pcVar12->size_expr == (coda_expression *)0x0) {
        puVar16 = (ulong *)0x0;
        if (pcVar12[1].type_class == coda_record_class) {
          *bit_size = local_3b0;
          return 0;
        }
        goto LAB_00142796;
      }
LAB_001428b4:
      iVar3 = pcVar12->type_class;
    }
    else if (iVar3 == 6) {
      if (pcVar12[1].format != 2) goto LAB_001428be;
      if (*(int *)(*(long *)&pcVar12[1].type_class + 8) != 4) {
        __assert_fail("base_type->type_class == coda_text_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      length = -1;
      if (*(int *)(*(long *)&pcVar12[1].type_class + 0x40) == 0) goto LAB_00142ab7;
      goto LAB_001428b4;
    }
    if (iVar3 == 6) {
LAB_001428be:
      memcpy(&local_348,cursor,0x310);
      iVar3 = coda_cursor_use_base_type_of_special_type(&local_348);
      if (iVar3 == 0) {
        iVar3 = coda_cursor_get_bit_size(&local_348,bit_size);
        return iVar3;
      }
      return -1;
    }
    if (pcVar12->size_expr != (coda_expression *)0x0) {
      iVar3 = coda_expression_eval_integer(pcVar12->size_expr,cursor,bit_size);
      if (iVar3 == 0) {
        lVar10 = *bit_size;
        if (pcVar12->bit_size == -8) {
          lVar10 = lVar10 << 3;
          *bit_size = lVar10;
        }
        if (-1 < lVar10) {
          return 0;
        }
        coda_set_error(-300,"calculated size is negative (%ld bits)");
      }
      else {
        coda_add_error_message(" for size expression");
      }
      coda_cursor_add_to_error_message(cursor);
      goto LAB_0014272b;
    }
    if (iVar3 - 2U < 2) {
      cVar1 = pcVar12->read_type;
      if (9 < (uint)cVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x329,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      if ((0x55U >> (cVar1 & 0x1f) & 1) == 0) {
        if ((0xaaU >> (cVar1 & 0x1f) & 1) == 0) {
          lVar10 = coda_ascii_parse_double(local_388,length,(double *)&local_348,1);
        }
        else {
          lVar10 = coda_ascii_parse_uint64(local_388,length,(uint64_t *)&local_348,1);
        }
      }
      else {
        lVar10 = coda_ascii_parse_int64(local_388,length,(int64_t *)&local_348,1);
      }
      if (lVar10 < 0) {
        return -1;
      }
      local_3b0 = lVar10 << 3;
LAB_00142ab7:
      *bit_size = local_3b0;
      return 0;
    }
    if (iVar3 != 4) {
      __assert_fail("type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    cVar5 = pcVar12[1].type_class;
    iVar3 = 0;
    switch(cVar5) {
    case coda_record_class:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    case coda_array_class:
      if (cursor->product->format != coda_format_ascii) {
        __assert_fail("cursor->product->format == coda_format_ascii",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      iVar3 = (int)cursor->product[1].file_size;
      if (iVar3 - 1U < 2) {
        *bit_size = 8;
        return 0;
      }
      if (iVar3 != 0) {
        if (iVar3 == 3) {
          *bit_size = 0x10;
          return 0;
        }
        return 0;
      }
      if ((paVar11[(long)cursor->n + -1].bit_offset & 7) == 0) {
        iVar3 = coda_ascii_cursor_read_bytes(cursor,&local_3b9,0,1);
        if (iVar3 == 0) {
          if (local_3b9 == '\r') {
            pcVar6 = cursor->product;
            if (1 < pcVar6->file_size - (paVar11[(long)cursor->n + -1].bit_offset >> 3)) {
              iVar3 = coda_ascii_cursor_read_bytes(cursor,&local_3b9,1,1);
              if (iVar3 != 0) goto LAB_0014272b;
              pcVar6 = cursor->product;
              if (local_3b9 == '\n') {
                *bit_size = 0x10;
                uVar7 = 3;
                goto LAB_00142dd0;
              }
            }
            *bit_size = 8;
            uVar7 = 2;
LAB_00142dd0:
            *(undefined4 *)&pcVar6[1].file_size = uVar7;
            return 0;
          }
          if (local_3b9 == '\n') {
            *bit_size = 8;
            pcVar6 = cursor->product;
            uVar7 = 1;
            goto LAB_00142dd0;
          }
          coda_str64(paVar11[(long)cursor->n + -1].bit_offset >> 3,(char *)&local_348);
          coda_set_error(-300,
                         "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                         ,&local_348);
        }
        goto LAB_0014272b;
      }
      message = "product error detected (ascii line separator does not start at byte boundary)";
      break;
    case coda_integer_class:
    case coda_real_class:
      product = cursor->product;
      if (product->format != coda_format_ascii) {
        uVar9 = (long)cursor->n * 3;
        if ((paVar11[(long)cursor->n + -1].bit_offset & 7U) == 0) {
          lVar14 = paVar11[(long)cursor->n + -1].bit_offset >> 3;
          lVar13 = 0;
          lVar15 = product->file_size - lVar14;
          lVar10 = lVar13;
          if (lVar15 != 0 && lVar14 <= product->file_size) {
            do {
              iVar3 = read_bytes_in_bounds(cursor->product,lVar14 + lVar13,1,&local_348);
              if (iVar3 != 0) goto LAB_0014272b;
              lVar10 = lVar13;
            } while ((((char)local_348.product != '\n') && ((char)local_348.product != '\r')) &&
                    (lVar13 = lVar13 + 1, lVar10 = lVar15, lVar15 != lVar13));
            cVar5 = pcVar12[1].type_class;
            uVar9 = (ulong)((char)local_348.product == '\r');
          }
          if (cVar5 != coda_integer_class) goto LAB_00142cbc;
          if (((uVar9 & 1) != 0) && (lVar10 + 1 < lVar15)) {
            iVar3 = read_bytes_in_bounds(cursor->product,lVar10 + 1 + lVar14,1,&local_348);
            if (iVar3 != 0) goto LAB_0014272b;
            if ((char)local_348.product == '\n') {
              lVar10 = lVar10 + 1;
            }
          }
          lVar10 = lVar10 + 1;
LAB_00142cbc:
          *bit_size = lVar10 << 3;
          return 0;
        }
LAB_00142b23:
        message = "product error detected (ascii line does not start at byte boundary)";
        break;
      }
      if ((paVar11[(long)cursor->n + -1].bit_offset & 7) != 0) goto LAB_00142b23;
      if (product[1].root_type == (coda_dynamic_type *)0x0) {
        iVar3 = coda_ascii_init_asciilines(product);
        if (iVar3 != 0) goto LAB_0014272b;
        product = cursor->product;
      }
      if (*(long *)&product[1].format != 0) {
        lVar14 = paVar11[(long)cursor->n + -1].bit_offset >> 3;
        lVar13 = 0;
        lVar10 = *(long *)&product[1].format + -1;
        if (lVar10 != 0) {
          do {
            lVar15 = (lVar10 + lVar13) / 2;
            if (*(long *)(&(product[1].root_type)->backend + lVar15 * 2) <= lVar14) {
              lVar13 = lVar15 + 1;
              lVar15 = lVar10;
            }
            lVar10 = lVar15;
          } while (lVar15 != lVar13);
        }
        lVar10 = (*(long *)(&(product[1].root_type)->backend + lVar13 * 2) - lVar14) * 8;
        *bit_size = lVar10;
        if (pcVar12[1].type_class == coda_real_class) {
          if ((lVar13 == *(long *)&product[1].format + -1) &&
             (*(int *)&product[1].product_definition == 0)) {
            return 0;
          }
          *bit_size = lVar10 + -8;
          if ((int)product[1].file_size == 3) {
            *bit_size = lVar10 + -0x10;
            return 0;
          }
          return 0;
        }
        return 0;
      }
      message = "trying to read from an empty file";
      iVar3 = -0x12d;
      goto LAB_00142b2f;
    case coda_text_class:
      if ((paVar11[(long)cursor->n + -1].bit_offset & 7U) == 0) {
        lVar15 = paVar11[(long)cursor->n + -1].bit_offset >> 3;
        lVar10 = cursor->product->file_size;
        lVar14 = 0;
        lVar13 = lVar10 - lVar15;
        if (lVar13 != 0 && lVar15 <= lVar10) {
          do {
            iVar3 = read_bytes_in_bounds(cursor->product,lVar15 + lVar14,1,&local_348);
            if (iVar3 != 0) goto LAB_0014272b;
          } while ((((char)local_348.product == ' ') ||
                   (lVar10 = lVar14, (char)local_348.product == '\t')) &&
                  (lVar14 = lVar14 + 1, lVar10 = lVar13, lVar13 != lVar14));
          lVar14 = lVar10 << 3;
        }
        *bit_size = lVar14;
        return 0;
      }
      message = "product error detected (ascii white space does not start at byte boundary)";
      break;
    default:
      goto switchD_001429e8_default;
    }
    iVar3 = -300;
LAB_00142b2f:
    coda_set_error(iVar3,message);
  }
LAB_0014272b:
  iVar3 = -1;
switchD_001429e8_default:
  return iVar3;
}

Assistant:

int coda_ascii_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_ascii_mappings *mappings = NULL;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size = -1;
    int use_buffer = 0;


    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
        return 0;
    }

    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        return coda_ascbin_cursor_get_bit_size(cursor, bit_size);
    }

    if (get_bit_size_boundary(cursor, &bit_size_boundary, -1) != 0)
    {
        return -1;
    }

    /* determine if there are ascii mappings */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        mappings = ((coda_type_number *)type)->mappings;
        use_buffer = (mappings != NULL || type->size_expr == NULL);
    }
    else if (type->type_class == coda_text_class)
    {
        if (type->size_expr == NULL && ((coda_type_text *)type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
        use_buffer = (type->size_expr == NULL);
    }
    else if (type->type_class == coda_special_class && ((coda_type_special *)type)->special_type == coda_special_time)
    {
        coda_type *base_type = ((coda_type_special *)type)->base_type;

        assert(base_type->type_class == coda_text_class);
        if (((coda_type_text *)base_type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
    }

    /* only read buffer when we are dealing with numbers (without size_expr) or if there are mappings */
    if (use_buffer)
    {
        if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
        {
            buffer_size = (long)(bit_size_boundary >> 3);
        }
        else
        {
            buffer_size = MAX_ASCII_NUMBER_LENGTH;
        }

        if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
        {
            return -1;
        }
    }

    if (mappings != NULL)
    {
        /* try to determine size from ascii mappings */
        /* TODO: this goes wrong if we have a mapping with a string length that exceeds MAX_ASCII_NUMBER_LENGTH
         * so we should actually also take into account the max mapping length when determining buffer_size */
        if (parse_mapping_size(buffer, buffer_size, mappings, bit_size))
        {
            return 0;
        }
    }

    if (type->type_class == coda_special_class)
    {
        coda_cursor spec_cursor;

        spec_cursor = *cursor;
        if (coda_cursor_use_base_type_of_special_type(&spec_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&spec_cursor, bit_size);
    }

    if (type->size_expr != NULL)
    {
        if (coda_expression_eval_integer(type->size_expr, cursor, bit_size) != 0)
        {
            coda_add_error_message(" for size expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        if (type->bit_size == -8)
        {
            /* convert byte size to bit size */
            *bit_size *= 8;
        }
        if (*bit_size < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)", (long)*bit_size);
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* parse the data to determine the size */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        long size;

        switch (type->read_type)
        {
            case coda_native_type_int8:
            case coda_native_type_int16:
            case coda_native_type_int32:
            case coda_native_type_int64:
                {
                    int64_t value;

                    size = coda_ascii_parse_int64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_uint8:
            case coda_native_type_uint16:
            case coda_native_type_uint32:
            case coda_native_type_uint64:
                {
                    uint64_t value;

                    size = coda_ascii_parse_uint64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_float:
            case coda_native_type_double:
                {
                    double value;

                    size = coda_ascii_parse_double(buffer, buffer_size, &value, 1);
                }
                break;
            default:
                assert(0);
                exit(1);
        }
        if (size < 0)
        {
            return -1;
        }
        *bit_size = size * 8;
        return 0;
    }

    /* only possible case left is the special text types */
    assert(type->type_class == coda_text_class);
    switch (((coda_type_text *)type)->special_text_type)
    {
        case ascii_text_line_separator:
            assert(cursor->product->format == coda_format_ascii);
            switch (((coda_ascii_product *)cursor->product)->end_of_line)
            {
                case eol_lf:
                case eol_cr:
                    *bit_size = 8;
                    break;
                case eol_crlf:
                    *bit_size = 16;
                    break;
                case eol_unknown:
                    {
                        uint8_t buffer[1];

                        /* accept either LINEFEED, CARRIAGE_RETURN, or CARRIAGE-RETURN/LINEFEED */

                        if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii line separator does not "
                                           "start at byte boundary)");
                            return -1;
                        }
                        if (coda_ascii_cursor_read_bytes(cursor, buffer, 0, 1) != 0)
                        {
                            return -1;
                        }

                        switch (*buffer)
                        {
                            case '\n': /* linefeed */
                                /* just a linefeed -> unix platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_lf;
                                break;
                            case '\r': /* carriage return */
                                if (cursor->product->file_size - (cursor->stack[cursor->n - 1].bit_offset >> 3) >= 2)
                                {
                                    if (coda_ascii_cursor_read_bytes(cursor, buffer, 1, 1) != 0)
                                    {
                                        return -1;
                                    }
                                    if (*buffer == '\n')
                                    {
                                        /* carriage return followed by linefeed -> dos platform convention */
                                        *bit_size = 16;
                                        ((coda_ascii_product *)cursor->product)->end_of_line = eol_crlf;
                                        break;
                                    }
                                }
                                /* just a carriage return -> mac platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_cr;
                                break;
                            default:
                                {
                                    char s[21];

                                    coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s);
                                    coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid end-of-line "
                                                   "sequence - not a carriage return or linefeed character - byte "
                                                   "offset = %s)", s);
                                    return -1;
                                }
                        }
                    }
            }
            break;
        case ascii_text_line_with_eol:
        case ascii_text_line_without_eol:
            if (cursor->product->format == coda_format_ascii)
            {
                int64_t byte_offset;
                long *asciiline_end_offset;
                long bottom_index;
                long top_index;

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }

                if (((coda_ascii_product *)cursor->product)->asciiline_end_offset == NULL)
                {
                    if (coda_ascii_init_asciilines(cursor->product) != 0)
                    {
                        return -1;
                    }
                }
                if (((coda_ascii_product *)cursor->product)->num_asciilines == 0)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read from an empty file");
                    return -1;
                }

                bottom_index = 0;
                top_index = ((coda_ascii_product *)cursor->product)->num_asciilines - 1;
                asciiline_end_offset = ((coda_ascii_product *)cursor->product)->asciiline_end_offset;
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;

                while (top_index != bottom_index)
                {
                    long index;

                    index = (bottom_index + top_index) / 2;
                    if (byte_offset < asciiline_end_offset[index])
                    {
                        top_index = index;
                    }
                    else
                    {
                        bottom_index = index + 1;
                    }
                }
                *bit_size = ((asciiline_end_offset[top_index] - byte_offset) << 3);

                /* remove length of eol if eol was not included in the asciiline type */
                /* and if the line does not end with eof */
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_without_eol)
                {
                    if (!(top_index == ((coda_ascii_product *)cursor->product)->num_asciilines - 1 &&
                          ((coda_ascii_product *)cursor->product)->lastline_ending == eol_unknown))
                    {
                        *bit_size -= 8;
                        if (((coda_ascii_product *)cursor->product)->end_of_line == eol_crlf)
                        {
                            *bit_size -= 8;
                        }
                    }
                }
            }
            else
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                /* not a pure ascii file -> don't use asciiline cache */

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer == '\r' || *buffer == '\n')
                    {
                        break;
                    }
                    byte_size++;
                }
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_with_eol)
                {
                    if (*buffer == '\r' && byte_size + 1 < available_bytes)
                    {
                        if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size + 1, 1, buffer) != 0)
                        {
                            return -1;
                        }
                        if (*buffer == '\n')
                        {
                            byte_size++;
                        }
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_whitespace:
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii white space does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer != ' ' && *buffer != '\t')
                    {
                        break;
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_default:
            assert(0);
            exit(1);
    }

    return 0;
}